

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resourcemodel.cpp
# Opt level: O0

int __thiscall FSSResourceModel::rowCount(FSSResourceModel *this,QModelIndex *parent)

{
  bool bVar1;
  int iVar2;
  undefined1 local_38 [8];
  QModelIndex p;
  QModelIndex *parent_local;
  FSSResourceModel *this_local;
  
  p.m = (QAbstractItemModel *)parent;
  bVar1 = QModelIndex::isValid(parent);
  if (bVar1) {
    QModelIndex::parent((QModelIndex *)local_38,(QModelIndex *)p.m);
    bVar1 = QModelIndex::isValid((QModelIndex *)local_38);
    if (bVar1) {
      this_local._4_4_ = 0;
    }
    else {
      iVar2 = QModelIndex::row((QModelIndex *)p.m);
      this_local._4_4_ = Data::get_resource_count(iVar2 + AssetArtLandscape);
    }
  }
  else {
    this_local._4_4_ = 0x21;
  }
  return this_local._4_4_;
}

Assistant:

int
FSSResourceModel::rowCount(const QModelIndex &parent) const {
  if (!parent.isValid()) {
    return static_cast<int>(Data::AssetCursor);
  }

  QModelIndex p = parent.parent();
  if (!p.isValid()) {
    return Data::get_resource_count((Data::Resource)(parent.row() + 1));
  }

  return 0;
}